

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O2

void __thiscall re2c::Go::~Go(Go *this)

{
  GoBitmap *this_00;
  ulong uStack_10;
  
  switch(this->type) {
  case SWITCH_IF:
    this_00 = (GoBitmap *)(this->info).switchif;
    if (this_00 != (GoBitmap *)0x0) {
      SwitchIf::~SwitchIf((SwitchIf *)this_00);
    }
    break;
  case BITMAP:
    this_00 = (this->info).bitmap;
    if (this_00 != (GoBitmap *)0x0) {
      GoBitmap::~GoBitmap(this_00);
    }
    uStack_10 = 0x20;
    goto LAB_0012b2ef;
  case CPGOTO:
    this_00 = (GoBitmap *)(this->info).cpgoto;
    if (this_00 != (GoBitmap *)0x0) {
      Cpgoto::~Cpgoto((Cpgoto *)this_00);
    }
    break;
  case DOT:
    this_00 = (GoBitmap *)(this->info).dot;
    if (this_00 != (GoBitmap *)0x0) {
      Dot::~Dot((Dot *)this_00);
    }
    break;
  default:
    return;
  }
  uStack_10 = 0x10;
LAB_0012b2ef:
  operator_delete(this_00,uStack_10);
  return;
}

Assistant:

Go::~Go ()
{
	switch (type)
	{
		case EMPTY:
			break;
		case SWITCH_IF:
			delete info.switchif;
			break;
		case BITMAP:
			delete info.bitmap;
			break;
		case CPGOTO:
			delete info.cpgoto;
			break;
		case DOT:
			delete info.dot;
			break;
	}
}